

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void reset_film_grain_chroma_params(aom_film_grain_t *pars)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x120) = 0;
  *(undefined4 *)(in_RDI + 0x264) = 0;
  *(undefined4 *)(in_RDI + 0x268) = 0;
  memset((void *)(in_RDI + 0xd0),0,0x50);
  memset((void *)(in_RDI + 0x1f0),0,100);
  *(undefined4 *)(in_RDI + 0xcc) = 0;
  *(undefined4 *)(in_RDI + 600) = 0;
  *(undefined4 *)(in_RDI + 0x25c) = 0;
  *(undefined4 *)(in_RDI + 0x27c) = 0;
  memset((void *)(in_RDI + 0x7c),0,0x50);
  memset((void *)(in_RDI + 0x18c),0,100);
  return;
}

Assistant:

static void reset_film_grain_chroma_params(aom_film_grain_t *pars) {
  pars->num_cr_points = 0;
  pars->cr_mult = 0;
  pars->cr_luma_mult = 0;
  memset(pars->scaling_points_cr, 0, sizeof(pars->scaling_points_cr));
  memset(pars->ar_coeffs_cr, 0, sizeof(pars->ar_coeffs_cr));
  pars->num_cb_points = 0;
  pars->cb_mult = 0;
  pars->cb_luma_mult = 0;
  pars->chroma_scaling_from_luma = 0;
  memset(pars->scaling_points_cb, 0, sizeof(pars->scaling_points_cb));
  memset(pars->ar_coeffs_cb, 0, sizeof(pars->ar_coeffs_cb));
}